

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlChar * xmlXPathCastNumberToString(double val)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  xmlChar *pxVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  char *pcVar9;
  long lVar10;
  double dVar11;
  char work [30];
  char buf [100];
  char local_a8 [32];
  double local_88;
  undefined8 local_78;
  undefined1 local_70;
  undefined1 local_46;
  undefined1 local_15;
  
  iVar8 = ((0.0 < val) - 1) + (uint)(0.0 < val);
  if (ABS(val) != INFINITY) {
    iVar8 = 0;
  }
  if (iVar8 == -1) {
    pxVar4 = xmlStrdup((xmlChar *)"-Infinity");
    return pxVar4;
  }
  if (iVar8 == 1) {
    pxVar4 = xmlStrdup("Infinity");
    return pxVar4;
  }
  if (NAN(val)) {
    pxVar4 = xmlStrdup((xmlChar *)"NaN");
    return pxVar4;
  }
  if ((val == 0.0) && (!NAN(val))) {
    pxVar4 = xmlStrdup("0");
    return pxVar4;
  }
  if (ABS(val) != INFINITY || val <= 0.0) {
    if ((-2147483648.0 < val) && (val < 2147483647.0)) {
      if (((double)(int)val == val) && (!NAN((double)(int)val) && !NAN(val))) {
        if ((int)val == 0) {
          pcVar6 = (char *)((long)&local_78 + 1);
          local_78 = CONCAT71(local_78._1_7_,0x30);
          pcVar9 = pcVar6;
        }
        else {
          snprintf(local_a8,0x1d,"%d");
          pcVar6 = (char *)&local_78;
          pcVar9 = pcVar6;
          if (local_a8[0] != '\0') {
            lVar10 = 1;
            do {
              *pcVar9 = local_a8[0];
              pcVar9 = pcVar9 + 1;
              local_a8[0] = local_a8[lVar10];
              pcVar6 = pcVar6 + 1;
              if (local_a8[0] == '\0') break;
              bVar2 = lVar10 < 99;
              lVar10 = lVar10 + 1;
            } while (bVar2);
          }
        }
        pcVar9[-(ulong)(0x62 < (long)pcVar6 - (long)&local_78)] = '\0';
        goto LAB_001bbc8e;
      }
    }
    dVar11 = ABS(val);
    if ((1000000000.0 < dVar11) || (dVar11 < 1e-05)) {
      uVar3 = snprintf(local_a8,0x1c,"%*.*e",val,0x15,0xe);
      if (0 < (int)uVar3) {
        do {
          if (local_a8[uVar3] == 'e') goto joined_r0x001bbbe9;
          bVar2 = 1 < (int)uVar3;
          uVar3 = uVar3 - 1;
        } while (bVar2);
        uVar3 = 0;
      }
    }
    else {
      local_88 = val;
      dVar11 = log10(dVar11);
      uVar3 = snprintf(local_a8,0x1c,"%0.*f",local_88,(ulong)((0 < (int)dVar11 ^ 0xf) - (int)dVar11)
                      );
    }
joined_r0x001bbbe9:
    while (pcVar6 = local_a8, local_a8[0] == ' ') {
      do {
        cVar1 = pcVar6[1];
        *pcVar6 = cVar1;
        pcVar6 = pcVar6 + 1;
      } while (cVar1 != '\0');
      uVar3 = uVar3 - 1;
    }
    pcVar9 = local_a8 + (int)uVar3;
    pcVar6 = pcVar9;
    do {
      pcVar7 = pcVar6;
      pcVar6 = pcVar7 + -1;
    } while (pcVar7[-1] == '0');
    if (pcVar7[-1] != '.') {
      pcVar6 = pcVar7;
    }
    lVar10 = 0;
    do {
      cVar1 = pcVar9[lVar10];
      pcVar6[lVar10] = cVar1;
      lVar10 = lVar10 + 1;
    } while (cVar1 != '\0');
    sVar5 = strlen(local_a8);
    iVar8 = (int)sVar5 + 1;
    if (99 < iVar8) {
      local_46 = 0;
      iVar8 = 99;
    }
    memcpy(&local_78,local_a8,(long)iVar8);
  }
  else {
    local_78 = 0x7974696e69666e49;
    local_70 = 0;
  }
LAB_001bbc8e:
  local_15 = 0;
  pxVar4 = xmlStrdup((xmlChar *)&local_78);
  return pxVar4;
}

Assistant:

xmlChar *
xmlXPathCastNumberToString (double val) {
    xmlChar *ret;
    switch (xmlXPathIsInf(val)) {
    case 1:
	ret = xmlStrdup((const xmlChar *) "Infinity");
	break;
    case -1:
	ret = xmlStrdup((const xmlChar *) "-Infinity");
	break;
    default:
	if (xmlXPathIsNaN(val)) {
	    ret = xmlStrdup((const xmlChar *) "NaN");
	} else if (val == 0) {
            /* Omit sign for negative zero. */
	    ret = xmlStrdup((const xmlChar *) "0");
	} else {
	    /* could be improved */
	    char buf[100];
	    xmlXPathFormatNumber(val, buf, 99);
	    buf[99] = 0;
	    ret = xmlStrdup((const xmlChar *) buf);
	}
    }
    return(ret);
}